

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O3

int fetch_all_stops_db(feed_db_t *db,stop_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  stop_t *psVar4;
  uchar *puVar5;
  long lVar6;
  sqlite3_stmt *stmt;
  stop_t record;
  char qr [190];
  sqlite3_stmt *local_4c0;
  double local_4b8;
  double local_4b0;
  stop_t local_4a8;
  char local_f8 [200];
  
  uVar2 = count_rows_db(db,"stops");
  if (0 < (int)uVar2) {
    memcpy(local_f8,
           "SELECT stop_id, stop_code, stop_name, stop_desc,stop_lat, stop_lon,zone_id, stop_url,location_type, parent_station, stop_timezone, wheelchair_boarding, level_id, platform_code FROM `stops`;"
           ,0xbe);
    sqlite3_prepare_v2(db->conn,local_f8,-1,&local_4c0,(char **)0x0);
    psVar4 = (stop_t *)malloc((ulong)uVar2 * 0x3b0);
    *records = psVar4;
    uVar1 = 0xffffffff;
    if (psVar4 != (stop_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_4c0);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_stop(&local_4a8);
        puVar5 = sqlite3_column_text(local_4c0,0);
        strcpy(local_4a8.id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_4c0,1);
        strcpy(local_4a8.code,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_4c0,2);
        strcpy(local_4a8.name,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_4c0,3);
        strcpy(local_4a8.desc,(char *)puVar5);
        local_4b0 = sqlite3_column_double(local_4c0,4);
        local_4a8.lat = (longdouble)local_4b0;
        local_4b8 = sqlite3_column_double(local_4c0,5);
        local_4a8.lon = (longdouble)local_4b8;
        puVar5 = sqlite3_column_text(local_4c0,6);
        strcpy(local_4a8.zone_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_4c0,7);
        strcpy(local_4a8.url,(char *)puVar5);
        local_4a8.location_type = sqlite3_column_int(local_4c0,8);
        puVar5 = sqlite3_column_text(local_4c0,9);
        strcpy(local_4a8.parent_station,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_4c0,10);
        strcpy(local_4a8.timezone,(char *)puVar5);
        local_4a8.wheelchair_boarding = sqlite3_column_int(local_4c0,0xb);
        puVar5 = sqlite3_column_text(local_4c0,0xc);
        strcpy(local_4a8.level_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_4c0,0xd);
        strcpy(local_4a8.platform_code,(char *)puVar5);
        memcpy((*records)->id + lVar6,&local_4a8,0x3b0);
        lVar6 = lVar6 + 0x3b0;
      } while ((ulong)uVar2 * 0x3b0 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_4c0);
  }
  return uVar2;
}

Assistant:

int fetch_all_stops_db(feed_db_t *db, stop_t **records) {

    stop_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "stops");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "stop_id, stop_code, stop_name, stop_desc,"
                    "stop_lat, stop_lon,"
                    "zone_id, stop_url,"
                    "location_type, parent_station, stop_timezone, wheelchair_boarding, "
                    "level_id, platform_code "
                "FROM `stops`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_stop(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.code, sqlite3_column_text(stmt, 1));
        strcpy(record.name, sqlite3_column_text(stmt, 2));
        strcpy(record.desc, sqlite3_column_text(stmt, 3));
        record.lat = sqlite3_column_double(stmt, 4);
        record.lon = sqlite3_column_double(stmt, 5);
        strcpy(record.zone_id, sqlite3_column_text(stmt, 6));
        strcpy(record.url, sqlite3_column_text(stmt, 7));
        record.location_type = (location_type_t)sqlite3_column_int(stmt, 8);
        strcpy(record.parent_station, sqlite3_column_text(stmt, 9));
        strcpy(record.timezone, sqlite3_column_text(stmt, 10));
        record.wheelchair_boarding = (wheelchair_boarding_t)sqlite3_column_int(stmt, 11);
        strcpy(record.level_id, sqlite3_column_text(stmt, 12));
        strcpy(record.platform_code, sqlite3_column_text(stmt, 13));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}